

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2BufferSharingTest::renderResource
          (GLES2BufferSharingTest *this,Surface *screen,Surface *reference)

{
  pointer *this_00;
  glUseProgramFunc p_Var1;
  glGetAttribLocationFunc p_Var2;
  glVertexAttribPointerFunc p_Var3;
  glDrawElementsFunc p_Var4;
  glReadPixelsFunc p_Var5;
  float x_00;
  GLuint GVar6;
  deUint64 __s;
  bool bVar7;
  GLenum GVar8;
  deBool dVar9;
  deUint32 dVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  TestError *pTVar14;
  size_type sVar15;
  reference pvVar16;
  reference pvVar17;
  void *pvVar18;
  byte *pbVar19;
  uint uVar20;
  float local_4dc;
  float local_4d8;
  RGBA local_350;
  float local_34c;
  float local_348;
  float val;
  float t;
  float s;
  deUint8 c;
  deUint8 b;
  deUint8 a;
  bool tri;
  float yf;
  float xf;
  int y;
  int x;
  int y2;
  int x2;
  int y1;
  int x1;
  int oy;
  int ox;
  float fy2;
  float fx2;
  float fy1;
  float fx1;
  int i_1;
  Vector<int,_4> local_2d8;
  PixelBufferAccess local_2c8;
  GLuint local_2a0;
  GLuint local_29c;
  GLuint colorLocation;
  GLuint gridLocation;
  int height;
  int width;
  float local_288;
  float local_284;
  float local_280;
  float local_27c;
  float local_278;
  float local_274;
  value_type_conflict3 local_270;
  value_type_conflict3 local_26e;
  value_type_conflict3 local_26c;
  value_type_conflict3 local_26a;
  value_type_conflict3 local_268;
  value_type_conflict3 local_266;
  uint local_264;
  undefined1 local_260 [4];
  int i;
  vector<float,_std::allocator<float>_> coords;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  string local_228;
  allocator<char> local_1f1;
  string local_1f0;
  ProgramSources local_1d0;
  undefined1 local_100 [8];
  ShaderProgram program;
  char *fragmentShader;
  char *vertexShader;
  Surface *reference_local;
  Surface *screen_local;
  GLES2BufferSharingTest *this_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)anon_var_dwarf_a4dbed;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,
             "attribute mediump vec2 a_pos;\nattribute mediump float a_color;\nvarying mediump float v_color;\nvoid main(void)\n{\n\tv_color = a_color;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
             ,&local_1f1);
  __s = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,(char *)__s,
             (allocator<char> *)
             ((long)&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  glu::makeVtxFragSources(&local_1d0,&local_1f0,&local_228);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)local_100,&(this->super_GLES2SharingTest).m_gl,&local_1d0);
  glu::ProgramSources::~ProgramSources(&local_1d0);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  bVar7 = glu::ShaderProgram::isOk((ShaderProgram *)local_100);
  if (!bVar7) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x168);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
             &coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_260);
  for (local_264 = 0; uVar20 = local_264,
      sVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_buffer),
      (int)uVar20 <
      (int)((long)((ulong)(uint)((int)sVar15 >> 0x1f) << 0x20 | sVar15 & 0xffffffff) / 4);
      local_264 = local_264 + 1) {
    local_266 = (value_type_conflict3)(local_264 << 2);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               &coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_266);
    local_268 = (short)local_264 * 4 + 1;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               &coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_268);
    local_26a = (short)local_264 * 4 + 2;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               &coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_26a);
    local_26c = (short)local_264 * 4 + 2;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               &coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_26c);
    local_26e = (short)local_264 * 4 + 3;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               &coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_26e);
    local_270 = (value_type_conflict3)(local_264 << 2);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               &coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_270);
    local_274 = (float)((int)local_264 % 0x10) * 0.125 + -1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_260,&local_274);
    local_278 = (float)(int)((float)(int)local_264 * 0.0625) * 0.125 + -1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_260,&local_278);
    local_27c = (float)((int)local_264 % 0x10) * 0.125 + -1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_260,&local_27c);
    local_280 = (float)((int)((float)(int)local_264 * 0.0625) + 1) * 0.125 + -1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_260,&local_280);
    uVar20 = local_264;
    if ((int)local_264 < 0) {
      uVar20 = local_264 + 0xf;
    }
    local_284 = (float)(int)((local_264 + 1) - (uVar20 & 0xfffffff0)) * 0.125 + -1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_260,&local_284);
    local_288 = (float)((int)((float)(int)local_264 * 0.0625) + 1) * 0.125 + -1.0;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_260,&local_288);
    uVar20 = local_264;
    if ((int)local_264 < 0) {
      uVar20 = local_264 + 0xf;
    }
    width = (int)((float)(int)((local_264 + 1) - (uVar20 & 0xfffffff0)) * 0.125 + -1.0);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_260,(value_type_conflict2 *)&width);
    height = (int)((float)(int)((float)(int)local_264 * 0.0625) * 0.125 + -1.0);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_260,(value_type_conflict2 *)&height);
  }
  gridLocation = 0xf0;
  colorLocation = 0xf0;
  if (screen != (Surface *)0x0) {
    gridLocation = tcu::Surface::getWidth(screen);
    colorLocation = tcu::Surface::getHeight(screen);
  }
  do {
    (*(this->super_GLES2SharingTest).m_gl.viewport)(0,0,gridLocation,colorLocation);
    GVar8 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar8,"viewport(0, 0, width, height)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x18e);
    dVar9 = ::deGetFalse();
  } while (dVar9 != 0);
  do {
    (*(this->super_GLES2SharingTest).m_gl.clearColor)(1.0,0.0,0.0,1.0);
    GVar8 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar8,"clearColor(1.0f, 0.0f, 0.0f, 1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,400);
    dVar9 = ::deGetFalse();
  } while (dVar9 != 0);
  do {
    (*(this->super_GLES2SharingTest).m_gl.clear)(0x4000);
    GVar8 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar8,"clear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x191);
    dVar9 = ::deGetFalse();
  } while (dVar9 != 0);
  do {
    p_Var1 = (this->super_GLES2SharingTest).m_gl.useProgram;
    dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
    (*p_Var1)(dVar10);
    GVar8 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar8,"useProgram(program.getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x193);
    dVar9 = ::deGetFalse();
  } while (dVar9 != 0);
  p_Var2 = (this->super_GLES2SharingTest).m_gl.getAttribLocation;
  dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
  local_29c = (*p_Var2)(dVar10,"a_pos");
  GVar8 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar8,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x196);
  while ((dVar9 = ::deGetFalse(), dVar9 == 0 && (local_29c != 0xffffffff))) {
    dVar9 = ::deGetFalse();
    if (dVar9 == 0) {
      p_Var2 = (this->super_GLES2SharingTest).m_gl.getAttribLocation;
      dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      local_2a0 = (*p_Var2)(dVar10,"a_color");
      GVar8 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar8,"glGetAttribLocation()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x19a);
      while ((dVar9 = ::deGetFalse(), dVar9 == 0 && (local_2a0 != 0xffffffff))) {
        dVar9 = ::deGetFalse();
        if (dVar9 == 0) {
          do {
            (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(local_2a0);
            GVar8 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar8,"enableVertexAttribArray(colorLocation)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x19d);
            dVar9 = ::deGetFalse();
          } while (dVar9 != 0);
          do {
            (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(local_29c);
            GVar8 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar8,"enableVertexAttribArray(gridLocation)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x19e);
            dVar9 = ::deGetFalse();
          } while (dVar9 != 0);
          do {
            (*(this->super_GLES2SharingTest).m_gl.bindBuffer)(0x8892,this->m_glBuffer);
            GVar8 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar8,"bindBuffer(GL_ARRAY_BUFFER, m_glBuffer)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x1a0);
            dVar9 = ::deGetFalse();
          } while (dVar9 != 0);
          do {
            (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                      (local_2a0,1,0x1401,'\x01',0,(void *)0x0);
            GVar8 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar8,
                            "vertexAttribPointer(colorLocation, 1, GL_UNSIGNED_BYTE, GL_TRUE, 0, DE_NULL)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x1a1);
            dVar9 = ::deGetFalse();
          } while (dVar9 != 0);
          do {
            (*(this->super_GLES2SharingTest).m_gl.bindBuffer)(0x8892,0);
            GVar8 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar8,"bindBuffer(GL_ARRAY_BUFFER, 0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x1a2);
            dVar9 = ::deGetFalse();
          } while (dVar9 != 0);
          do {
            GVar6 = local_29c;
            p_Var3 = (this->super_GLES2SharingTest).m_gl.vertexAttribPointer;
            pvVar16 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_260,0);
            (*p_Var3)(GVar6,2,0x1406,'\0',0,pvVar16);
            GVar8 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar8,
                            "vertexAttribPointer(gridLocation, 2, GL_FLOAT, GL_FALSE, 0, &(coords[0]))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x1a4);
            dVar9 = ::deGetFalse();
          } while (dVar9 != 0);
          do {
            p_Var4 = (this->super_GLES2SharingTest).m_gl.drawElements;
            this_00 = &coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            sVar15 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                               ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this_00);
            pvVar17 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this_00,
                                 0);
            (*p_Var4)(4,(GLsizei)sVar15,0x1403,pvVar17);
            GVar8 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar8,
                            "drawElements(GL_TRIANGLES, (GLsizei)indices.size(), GL_UNSIGNED_SHORT, &(indices[0]))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x1a6);
            dVar9 = ::deGetFalse();
          } while (dVar9 != 0);
          do {
            (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(local_2a0);
            GVar8 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar8,"disableVertexAttribArray(colorLocation)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x1a7);
            dVar9 = ::deGetFalse();
          } while (dVar9 != 0);
          do {
            (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(local_29c);
            GVar8 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar8,"disableVertexAttribArray(gridLocation)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x1a8);
            dVar9 = ::deGetFalse();
          } while (dVar9 != 0);
          do {
            (*(this->super_GLES2SharingTest).m_gl.useProgram)(0);
            GVar8 = (*(this->super_GLES2SharingTest).m_gl.getError)();
            glu::checkError(GVar8,"useProgram(0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                            ,0x1aa);
            dVar9 = ::deGetFalse();
          } while (dVar9 != 0);
          if (screen != (Surface *)0x0) {
            tcu::Surface::getAccess(&local_2c8,reference);
            tcu::Vector<int,_4>::Vector(&local_2d8,0xff,0,0,0xff);
            tcu::clear(&local_2c8,&local_2d8);
            p_Var5 = (this->super_GLES2SharingTest).m_gl.readPixels;
            iVar11 = tcu::Surface::getWidth(screen);
            iVar12 = tcu::Surface::getHeight(screen);
            tcu::Surface::getAccess((PixelBufferAccess *)&fx1,screen);
            pvVar18 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&fx1);
            (*p_Var5)(0,0,iVar11,iVar12,0x1908,0x1401,pvVar18);
            for (fy1 = 0.0; fVar13 = fy1,
                sVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                   (&this->m_buffer),
                (int)fVar13 <
                (int)((long)((ulong)(uint)((int)sVar15 >> 0x1f) << 0x20 | sVar15 & 0xffffffff) / 4);
                fy1 = (float)((int)fy1 + 1)) {
              fx2 = (float)((int)fy1 % 0x10) * 0.125 + -1.0;
              fy2 = (float)(int)((float)(int)fy1 * 0.0625) * 0.125 + -1.0;
              fVar13 = fy1;
              if ((int)fy1 < 0) {
                fVar13 = (float)((int)fy1 + 0xf);
              }
              ox = (int)((float)(int)(((int)fy1 + 1) - ((uint)fVar13 & 0xfffffff0)) * 0.125 + -1.0);
              oy = (int)((float)((int)((float)(int)fy1 * 0.0625) + 1) * 0.125 + -1.0);
              x1 = ::deRoundFloatToInt32((float)(int)gridLocation * 0.5);
              y1 = ::deRoundFloatToInt32((float)(int)colorLocation * 0.5);
              x2 = ::deRoundFloatToInt32((float)(int)gridLocation * fx2 * 0.5 + (float)x1);
              y2 = ::deRoundFloatToInt32((float)(int)colorLocation * fy2 * 0.5 + (float)y1);
              x = ::deRoundFloatToInt32((float)(int)gridLocation * (float)ox * 0.5 + (float)x1);
              y = ::deRoundFloatToInt32((float)(int)colorLocation * (float)oy * 0.5 + (float)y1);
              for (xf = (float)x2; (int)xf < x; xf = (float)((int)xf + 1)) {
                for (yf = (float)y2; (int)yf < y; yf = (float)((int)yf + 1)) {
                  _c = ((float)((int)xf - x2) + 0.5) / (float)(x - x2);
                  s = ((float)((int)yf - y2) + 0.5) / (float)(y - y2);
                  t._3_1_ = _c <= s;
                  iVar11 = 3;
                  if ((bool)t._3_1_) {
                    iVar11 = 1;
                  }
                  pbVar19 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      (&this->m_buffer,(long)((int)fy1 * 4 + iVar11));
                  t._2_1_ = *pbVar19;
                  iVar11 = 0;
                  if ((t._3_1_ & 1) != 0) {
                    iVar11 = 2;
                  }
                  pbVar19 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      (&this->m_buffer,(long)((int)fy1 * 4 + iVar11));
                  t._1_1_ = *pbVar19;
                  iVar11 = 2;
                  if ((t._3_1_ & 1) != 0) {
                    iVar11 = 0;
                  }
                  pbVar19 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                      (&this->m_buffer,(long)((int)fy1 * 4 + iVar11));
                  x_00 = xf;
                  fVar13 = yf;
                  t._0_1_ = *pbVar19;
                  if ((t._3_1_ & 1) == 0) {
                    local_4d8 = 1.0 - _c;
                  }
                  else {
                    local_4d8 = _c;
                  }
                  val = local_4d8;
                  if ((t._3_1_ & 1) == 0) {
                    local_4dc = s;
                  }
                  else {
                    local_4dc = 1.0 - s;
                  }
                  local_348 = local_4dc;
                  local_34c = (float)(int)((uint)t._0_1_ - (uint)t._2_1_) * local_4dc +
                              (float)(int)((uint)t._1_1_ - (uint)t._2_1_) * local_4d8 +
                              (float)t._2_1_;
                  uVar20 = (int)local_34c & 0xff;
                  tcu::RGBA::RGBA(&local_350,uVar20,uVar20,uVar20,0xff);
                  tcu::Surface::setPixel(reference,(int)x_00,(int)fVar13,local_350);
                }
              }
            }
          }
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)local_260);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     &coords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
          return;
        }
      }
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar14,(char *)0x0,"colorLocation != (GLuint)-1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                 ,0x19b);
      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar14,(char *)0x0,"gridLocation != (GLuint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
             ,0x197);
  __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void GLES2BufferSharingTest::renderResource (tcu::Surface* screen, tcu::Surface* reference)
{
	DE_ASSERT((screen && reference) || (!screen && !reference));

	const char* vertexShader = ""
	"attribute mediump vec2 a_pos;\n"
	"attribute mediump float a_color;\n"
	"varying mediump float v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tv_color = a_color;\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}\n";

	const char* fragmentShader = ""
	"varying mediump float v_color;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_FragColor = vec4(v_color, v_color, v_color, 1.0);\n"
	"}\n";

	glu::ShaderProgram program(m_gl, glu::makeVtxFragSources(vertexShader, fragmentShader));

	if (!program.isOk())
		TCU_FAIL("Failed to compile shader program");

	std::vector<deUint16>	indices;
	std::vector<float>		coords;

	DE_ASSERT(m_buffer.size() % 4 == 0);

	for (int i = 0; i < (int)m_buffer.size() / 4; i++)
	{
		indices.push_back((deUint16)(i*4));
		indices.push_back((deUint16)(i*4 + 1));
		indices.push_back((deUint16)(i*4 + 2));
		indices.push_back((deUint16)(i*4 + 2));
		indices.push_back((deUint16)(i*4 + 3));
		indices.push_back((deUint16)(i*4));

		coords.push_back(0.125f * (float)(i % 16) - 1.0f);
		coords.push_back(0.125f * (float)((int)((float)i / 16.0f)) - 1.0f);

		coords.push_back(0.125f * (float)(i % 16) - 1.0f);
		coords.push_back(0.125f * (float)((int)((float)i / 16.0f) + 1) - 1.0f);

		coords.push_back(0.125f * (float)((i % 16) + 1) - 1.0f);
		coords.push_back(0.125f * (float)((int)((float)i / 16.0f) + 1) - 1.0f);

		coords.push_back(0.125f * (float)((i % 16) + 1) - 1.0f);
		coords.push_back(0.125f * (float)((int)((float)i / 16.0f)) - 1.0f);
	}

	int width = 240;
	int height = 240;

	if (screen)
	{
		width = screen->getWidth();
		height = screen->getHeight();
	}

	GLU_CHECK_GLW_CALL(m_gl, viewport(0, 0, width, height));

	GLU_CHECK_GLW_CALL(m_gl, clearColor(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, clear(GL_COLOR_BUFFER_BIT));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program.getProgram()));

	GLuint gridLocation = m_gl.getAttribLocation(program.getProgram(), "a_pos");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(gridLocation != (GLuint)-1);

	GLuint colorLocation = m_gl.getAttribLocation(program.getProgram(), "a_color");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(colorLocation != (GLuint)-1);

	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(gridLocation));

	GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, m_glBuffer));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(colorLocation, 1, GL_UNSIGNED_BYTE, GL_TRUE, 0, DE_NULL));
	GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, 0));

	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(gridLocation, 2, GL_FLOAT, GL_FALSE, 0, &(coords[0])));

	GLU_CHECK_GLW_CALL(m_gl, drawElements(GL_TRIANGLES, (GLsizei)indices.size(), GL_UNSIGNED_SHORT, &(indices[0])));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(gridLocation));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));

	if (screen)
	{
		tcu::clear(reference->getAccess(), tcu::IVec4(0xff, 0, 0, 0xff));
		m_gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());
		for (int i = 0; i < (int)m_buffer.size() / 4; i++)
		{
			float fx1 = 0.125f * (float)(i % 16) - 1.0f;
			float fy1 = 0.125f * (float)((int)((float)i / 16.0f)) - 1.0f;
			float fx2 = 0.125f * (float)((i % 16) + 1) - 1.0f;
			float fy2 = 0.125f * (float)((int)((float)i / 16.0f) + 1) - 1.0f;

			int ox = deRoundFloatToInt32((float)width	/ 2.0f);
			int oy = deRoundFloatToInt32((float)height	/ 2.0f);
			int x1 = deRoundFloatToInt32(((float)width	 * fx1 / 2.0f) + (float)ox);
			int y1 = deRoundFloatToInt32(((float)height	 * fy1 / 2.0f) + (float)oy);
			int x2 = deRoundFloatToInt32(((float)width	 * fx2 / 2.0f) + (float)ox);
			int y2 = deRoundFloatToInt32(((float)height	 * fy2 / 2.0f) + (float)oy);

			for (int x = x1; x < x2; x++)
			{
				for (int y = y1; y < y2; y++)
				{
					float		xf		= ((float)(x-x1) + 0.5f) / (float)(x2 - x1);
					float		yf		= ((float)(y-y1) + 0.5f) / (float)(y2 - y1);
					bool		tri		= yf >= xf;
					deUint8		a		= m_buffer[i*4 + (tri ? 1 : 3)];
					deUint8		b		= m_buffer[i*4 + (tri ? 2 : 0)];
					deUint8		c		= m_buffer[i*4 + (tri ? 0 : 2)];
					float		s		= tri ? xf : 1.0f-xf;
					float		t		= tri ? 1.0f-yf : yf;
					float		val		= (float)a + (float)(b-a)*s + (float)(c-a)*t;

					reference->setPixel(x, y, tcu::RGBA((deUint8)val, (deUint8)val, (deUint8)val, 255));
				}
			}
		}
	}
}